

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testInit
          (XFBInvalidOffsetAlignmentTest *this)

{
  GLuint GVar1;
  TYPES type_00;
  undefined8 uVar2;
  GLuint GVar3;
  Type TVar4;
  undefined1 local_60 [8];
  testCase test_case;
  GLuint offset;
  GLuint stage;
  GLuint base_alingment;
  GLuint local_38;
  undefined8 local_2c;
  GLuint local_24;
  undefined8 *local_20;
  Type *type;
  GLuint i;
  GLuint n_types;
  XFBInvalidOffsetAlignmentTest *this_local;
  
  _i = this;
  type._4_4_ = TestBase::getTypesNumber((TestBase *)this);
  for (type._0_4_ = 0; (uint)type < type._4_4_; type._0_4_ = (uint)type + 1) {
    TVar4 = TestBase::getType((TestBase *)this,(uint)type);
    _stage = TVar4._0_8_;
    local_2c = _stage;
    uVar2 = local_2c;
    local_38 = TVar4.m_n_rows;
    local_24 = local_38;
    local_20 = &local_2c;
    local_2c._0_4_ = TVar4.m_basic_type;
    type_00 = (TYPES)local_2c;
    local_2c = uVar2;
    GVar3 = Utils::Type::GetTypeSize(type_00);
    for (test_case.m_type.m_n_rows = 0; test_case.m_type.m_n_rows < 6;
        test_case.m_type.m_n_rows = test_case.m_type.m_n_rows + 1) {
      if (((test_case.m_type.m_n_rows != 0) && (test_case.m_type.m_n_rows != 2)) &&
         (GVar1 = GVar3, test_case.m_type.m_n_rows != 5)) {
        while (test_case.m_type.m_n_columns = GVar1 + 1, test_case.m_type.m_n_columns < GVar3 << 1)
        {
          local_60._0_4_ = test_case.m_type.m_n_columns;
          local_60._4_4_ = test_case.m_type.m_n_rows;
          test_case._0_8_ = *local_20;
          test_case.m_type.m_basic_type = *(TYPES *)(local_20 + 1);
          std::
          vector<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_60);
          GVar1 = test_case.m_type.m_n_columns;
        }
      }
    }
  }
  return;
}

Assistant:

void XFBInvalidOffsetAlignmentTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type			  = getType(i);
		const GLuint	   base_alingment = Utils::Type::GetTypeSize(type.m_basic_type);

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			for (GLuint offset = base_alingment + 1; offset < 2 * base_alingment; ++offset)
			{
				testCase test_case = { offset, (Utils::Shader::STAGES)stage, type };

				m_test_cases.push_back(test_case);
			}
		}
	}
}